

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenFile.cpp
# Opt level: O0

bool CascOpenFileByCKey(HANDLE hStorage,PQUERY_KEY pCKey,DWORD dwOpenFlags,HANDLE *phFile)

{
  TCascStorage *hs_00;
  TCascStorage *hs;
  HANDLE *phFile_local;
  DWORD dwOpenFlags_local;
  PQUERY_KEY pCKey_local;
  HANDLE hStorage_local;
  
  hs_00 = IsValidCascStorageHandle(hStorage);
  if (hs_00 == (TCascStorage *)0x0) {
    SetLastError(9);
    hStorage_local._7_1_ = false;
  }
  else if ((((pCKey == (PQUERY_KEY)0x0) || (pCKey->pbData == (LPBYTE)0x0)) || (pCKey->cbData == 0))
          || (phFile == (HANDLE *)0x0)) {
    SetLastError(0x16);
    hStorage_local._7_1_ = false;
  }
  else {
    hStorage_local._7_1_ = OpenFileByCKey(hs_00,pCKey,dwOpenFlags,(TCascFile **)phFile);
  }
  return hStorage_local._7_1_;
}

Assistant:

bool WINAPI CascOpenFileByCKey(HANDLE hStorage, PQUERY_KEY pCKey, DWORD dwOpenFlags, HANDLE * phFile)
{
    TCascStorage * hs;

    // Validate the storage handle
    hs = IsValidCascStorageHandle(hStorage);
    if(hs == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return false;
    }

    // Validate the other parameters
    if(pCKey == NULL || pCKey->pbData == NULL || pCKey->cbData == 0 || phFile == NULL)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return false;
    }

    // Use the internal function fo open the file
    return OpenFileByCKey(hs, pCKey, dwOpenFlags, (TCascFile **)phFile);
}